

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::DefaultExtendsClauseArgSyntax>
          (DeepCloneVisitor *this,DefaultExtendsClauseArgSyntax *node,BumpAllocator *alloc)

{
  DefaultExtendsClauseArgSyntax *pDVar1;
  Token local_50;
  Token local_40;
  Token local_30;
  
  local_30 = parsing::Token::deepClone(&node->openParen,alloc);
  local_40 = parsing::Token::deepClone(&node->defaultKeyword,alloc);
  local_50 = parsing::Token::deepClone(&node->closeParen,alloc);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DefaultExtendsClauseArgSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_30,&local_40,&local_50);
  return &pDVar1->super_SyntaxNode;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }